

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PushPopTest.cpp
# Opt level: O0

void __thiscall
PushPopTest_RandomOrder_Test::PushPopTest_RandomOrder_Test(PushPopTest_RandomOrder_Test *this)

{
  undefined8 *in_RDI;
  
  PushPopTest::PushPopTest(&this->super_PushPopTest);
  *in_RDI = &PTR__PushPopTest_RandomOrder_Test_001ce6f0;
  in_RDI[2] = &PTR__PushPopTest_RandomOrder_Test_001ce730;
  return;
}

Assistant:

TEST_P(PushPopTest, RandomOrder) {
    std::size_t n = GetParam();

    for (std::size_t i = 0; i < n; ++i) {
        int x = nextRandom();
        myDeque.push_back(x);
        stdDeque.push_back(x);
        int y = nextRandom();
        myDeque.push_front(y);
        stdDeque.push_front(y);
    }

    ASSERT_EQ(myDeque.size(), stdDeque.size());

    while (!stdDeque.empty()) {
        int s = stdDeque.back();
        int m = myDeque.back();
        ASSERT_EQ(s, m);
        stdDeque.pop_back();
        myDeque.pop_back();
    }
}